

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  undefined1 local_b0 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> b;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> a;
  string local_50 [8];
  string sb;
  string local_30 [8];
  string sa;
  int local_10;
  int local_c;
  int fb;
  int fa;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::operator<<((ostream *)&std::cout,"Enter CP::pair<int,string> A: ");
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_c);
  std::operator>>(piVar2,local_30);
  std::operator<<((ostream *)&std::cout,"Enter CP::pair<int,string> B: ");
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::operator>>(piVar2,local_50);
  CP::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)&b.field_0x20,&local_c,
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  CP::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_b0,&local_10,
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  poVar3 = std::operator<<((ostream *)&std::cout,"Result of a >= b is ");
  bVar1 = CP::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator>=((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&b.field_0x20,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Result of b >= a is ");
  bVar1 = CP::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator>=((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b0,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&b.field_0x20);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  CP::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_b0);
  CP::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&b.field_0x20);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
    int fa,fb;
    std::string sa,sb;

    std::cout << "Enter CP::pair<int,string> A: ";
    std::cin >> fa >> sa;
    std::cout << "Enter CP::pair<int,string> B: ";
    std::cin >> fb >> sb;

    CP::pair<int,std::string> a(fa,sa), b(fb,sb);

    std::cout << "Result of a >= b is " << (a >= b) << std::endl;
    std::cout << "Result of b >= a is " << (b >= a) << std::endl;
}